

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.cpp
# Opt level: O3

bool __thiscall acto::core::worker_t::process(worker_t *this)

{
  mutex *__mutex;
  bool bVar1;
  int iVar2;
  long lVar3;
  runtime_t *prVar4;
  object_t *poVar5;
  rep rVar6;
  long *local_40;
  long *local_38;
  undefined4 extraout_var;
  
  poVar5 = this->object_;
  bVar1 = true;
  if (poVar5 != (object_t *)0x0) {
    do {
      __mutex = &poVar5->cs;
LAB_001080ee:
      do {
        object_t::select_message(poVar5);
        if (local_38 == (long *)0x0) {
LAB_00108151:
          bVar1 = true;
        }
        else {
          local_40 = local_38;
          local_38 = (long *)0x0;
          (*this->slots_->_vptr_callbacks[2])(this->slots_,poVar5,&local_40);
          if (local_40 != (long *)0x0) {
            (**(code **)(*local_40 + 8))();
          }
          local_40 = (long *)0x0;
          if (((poVar5->field_0x60 & 2) == 0) &&
             (lVar3 = std::chrono::_V2::steady_clock::now(),
             (this->time_slice_).__r < lVar3 - (this->start_).__d.__r)) goto LAB_00108151;
          bVar1 = false;
        }
        if (local_38 != (long *)0x0) {
          (**(code **)(*local_38 + 8))();
        }
      } while (!bVar1);
      iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar2 != 0) {
        std::__throw_system_error(iVar2);
      }
      if ((poVar5->field_0x60 & 4) == 0) {
        if ((poVar5->field_0x60 & 2) != 0) {
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          return true;
        }
        bVar1 = object_t::has_messages(poVar5);
        if (bVar1) {
          (*this->slots_->_vptr_callbacks[5])(this->slots_,poVar5);
        }
        else {
          poVar5->field_0x60 = poVar5->field_0x60 & 0xf7;
        }
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        goto LAB_001081fb;
      }
      bVar1 = object_t::has_messages(poVar5);
      if (bVar1) {
        (this->time_slice_).__r = 0x7fffffffffffffff;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        goto LAB_001080ee;
      }
      poVar5->field_0x60 = poVar5->field_0x60 & 0xf7;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      (*this->slots_->_vptr_callbacks[3])(this->slots_,poVar5);
LAB_001081fb:
      prVar4 = runtime_t::instance();
      runtime_t::release(prVar4,poVar5);
      iVar2 = (*this->slots_->_vptr_callbacks[6])();
      poVar5 = (object_t *)CONCAT44(extraout_var,iVar2);
      this->object_ = poVar5;
      bVar1 = poVar5 != (object_t *)0x0;
      if (poVar5 == (object_t *)0x0) {
        return bVar1;
      }
      rVar6 = std::chrono::_V2::steady_clock::now();
      (this->start_).__d.__r = rVar6;
      prVar4 = runtime_t::instance();
      runtime_t::acquire(prVar4,this->object_);
      poVar5 = this->object_;
    } while (poVar5 != (object_t *)0x0);
  }
  return bVar1;
}

Assistant:

bool worker_t::process() {
  while (object_t* const obj = object_) {
    bool need_delete = false;

    while (true) {
      // Handle a message.
      if (auto msg = obj->select_message()) {
        slots_->handle_message(obj, std::move(msg));
        // Continue processing messages if the object is bound to the thread or
        // the time slice has not been elapsed yet.
        if (obj->exclusive ||
            time_slice_ >= (std::chrono::steady_clock::now() - start_))
        {
          continue;
        }
      }

      // There are no messages in the object's mailbox or
      // the time slice was elapsed.
      std::lock_guard<std::mutex> g(obj->cs);

      if (obj->deleting) {
        // Drain the object's mailbox if it in the deleting state.
        if (obj->has_messages()) {
          time_slice_ = std::chrono::steady_clock::duration::max();
          continue;
        }

        need_delete = true;
        obj->scheduled = false;
      } else if (obj->exclusive) {
        // Just wait for new messages if the object
        // exclusively bound to the thread.
        return true;
      } else if (obj->has_messages()) {
        // Return object to the shared queue.
        slots_->push_object(obj);
      } else {
        obj->scheduled = false;
      }

      break;
    }

    if (need_delete) {
      slots_->push_delete(obj);
    }
    // Release current object.
    runtime_t::instance()->release(obj);

    // Retrieve next object from the shared queue.
    if ((object_ = slots_->pop_object())) {
      start_ = std::chrono::steady_clock::now();
      runtime_t::instance()->acquire(object_);
    } else {
      // Nothing to do.
      // Put itself to the idle list.
      return false;
    }
  }

  return true;
}